

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

void __thiscall FIX::SessionState::clearQueue(SessionState *this)

{
  Locker local_18;
  Locker l;
  SessionState *this_local;
  
  l.m_mutex = (Mutex *)this;
  Locker::Locker(&local_18,&this->m_mutex);
  std::map<int,_FIX::Message,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::Message>_>_>
  ::clear(&this->m_queue);
  Locker::~Locker(&local_18);
  return;
}

Assistant:

void clearQueue()
  { Locker l( m_mutex ); m_queue.clear(); }